

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse41_128_64.c
# Opt level: O2

parasail_result_t *
parasail_sw_table_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  int *piVar4;
  undefined8 uVar5;
  ushort uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  int iVar9;
  parasail_result_t *result;
  __m128i *palVar10;
  __m128i *palVar11;
  __m128i *b;
  ulong uVar12;
  uint uVar13;
  size_t len;
  size_t len_00;
  ulong uVar14;
  ulong uVar15;
  char *pcVar16;
  longlong extraout_RDX;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong size;
  long lVar20;
  uint uVar21;
  long lVar22;
  char *__format;
  __m128i *palVar23;
  int iVar24;
  ulong uVar26;
  ulong uVar27;
  __m128i *ptr;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  long lVar34;
  longlong lVar37;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  __m128i_64_t B_3;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  __m128i_64_t B;
  undefined1 auVar41 [16];
  __m128i_64_t B_2;
  undefined1 auVar42 [16];
  __m128i_64_t B_1;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  __m128i c;
  __m128i c_00;
  __m128i b_00;
  __m128i b_01;
  __m128i a;
  __m128i a_00;
  __m128i *local_130;
  long local_128;
  long lStack_120;
  long local_d8;
  ulong uStack_90;
  ulong uStack_40;
  uint uVar25;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar16 = "profile";
  }
  else {
    pvVar2 = (profile->profile64).score;
    if (pvVar2 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar16 = "profile->profile64.score";
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar16 = "profile->matrix";
      }
      else {
        uVar25 = profile->s1Len;
        if ((int)uVar25 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar16 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar16 = "s2";
        }
        else {
          uVar27 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar16 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar16 = "open";
          }
          else {
            if (-1 < gap) {
              iVar9 = ppVar3->max;
              result = parasail_result_new_table1((uint)((ulong)uVar25 + 1) & 0x7ffffffe,s2Len);
              if (result != (parasail_result_t *)0x0) {
                size = (ulong)uVar25 + 1 >> 1;
                result->flag = result->flag | 0x2820804;
                palVar10 = parasail_memalign___m128i(0x10,size);
                local_130 = parasail_memalign___m128i(0x10,size);
                palVar11 = parasail_memalign___m128i(0x10,size);
                b = parasail_memalign___m128i(0x10,size);
                if ((b != (__m128i *)0x0 && palVar11 != (__m128i *)0x0) &&
                    (local_130 != (__m128i *)0x0 && palVar10 != (__m128i *)0x0)) {
                  uVar28 = (ulong)(uint)gap;
                  len = ~(long)iVar9 + 0x7fffffffffffffff;
                  c[1] = 0x7fffffffffffffff;
                  c[0] = size;
                  len_00 = len;
                  parasail_memset___m128i(palVar10,c,len);
                  c_00[1] = extraout_RDX;
                  c_00[0] = size;
                  palVar23 = b;
                  parasail_memset___m128i(b,c_00,len_00);
                  uVar26 = 0;
                  uVar7 = (uint)size;
                  lVar20 = size * uVar27 * 4;
                  local_d8 = -0x4000000000000000;
                  uVar19 = 0;
                  uVar18 = 0;
                  auVar42 = _DAT_008a1de0;
                  do {
                    uVar21 = (uint)uVar26;
                    ptr = palVar10;
                    if (uVar18 == uVar27) {
LAB_00667b3b:
                      if (local_d8 == 0x7fffffffffffffff) {
                        *(byte *)&result->flag = (byte)result->flag | 0x40;
                      }
                      iVar9 = parasail_result_is_saturated(result);
                      palVar10 = palVar11;
                      if (iVar9 == 0) {
                        if (uVar21 == s2Len - 2U) {
                          palVar10 = local_130;
                        }
                        if (uVar21 == s2Len - 1U) {
                          palVar10 = ptr;
                          ptr = palVar11;
                        }
                        iVar9 = uVar25 - 1;
                        for (uVar27 = 0; (uVar7 & 0x3fffffff) * 2 != (int)uVar27;
                            uVar27 = uVar27 + 1) {
                          if ((*palVar10)[uVar27] == local_d8) {
                            uVar25 = 0;
                            if ((uVar27 & 1) != 0) {
                              uVar25 = uVar7;
                            }
                            iVar24 = uVar25 + ((uint)(uVar27 >> 1) & 0x7fffffff);
                            if (iVar24 < iVar9) {
                              iVar9 = iVar24;
                            }
                          }
                        }
                        if (uVar21 != s2Len - 2U) {
                          palVar11 = local_130;
                        }
                        if (uVar21 != s2Len - 1U) {
                          local_130 = palVar11;
                        }
                      }
                      else {
                        uVar21 = 0;
                        local_d8 = -1;
                        iVar9 = 0;
                      }
                      result->score = (int)local_d8;
                      result->end_query = iVar9;
                      result->end_ref = uVar21;
                      parasail_free(b);
                      parasail_free(palVar10);
                      parasail_free(local_130);
                      parasail_free(ptr);
                      return result;
                    }
                    lVar37 = palVar10[uVar7 - 1][0];
                    iVar9 = ppVar3->mapper[(byte)s2[uVar18]];
                    uVar13 = (int)uVar18 - 2;
                    ptr = local_130;
                    if (uVar21 == uVar13) {
                      ptr = palVar11;
                    }
                    lVar34 = 0;
                    auVar43 = (undefined1  [16])0x0;
                    uVar17 = uVar19;
                    for (lVar22 = 0; uStack_90 = (ulong)(uint)gap, size * 0x10 != lVar22;
                        lVar22 = lVar22 + 0x10) {
                      plVar1 = (long *)((long)pvVar2 + lVar22 + (long)(int)(iVar9 * uVar7) * 0x10);
                      auVar35._0_8_ = lVar34 + *plVar1;
                      auVar35._8_8_ = lVar37 + plVar1[1];
                      auVar36 = *(undefined1 (*) [16])((long)*b + lVar22);
                      auVar38._0_8_ = -(ulong)(auVar36._0_8_ < auVar35._0_8_);
                      auVar38._8_8_ = -(ulong)(auVar36._8_8_ < auVar35._8_8_);
                      auVar38 = blendvpd(auVar36,auVar35,auVar38);
                      auVar29._0_8_ = -(ulong)(auVar43._0_8_ < auVar38._0_8_);
                      auVar29._8_8_ = -(ulong)(auVar43._8_8_ < auVar38._8_8_);
                      auVar38 = blendvpd(auVar43,auVar38,auVar29);
                      auVar39._0_8_ = -(ulong)(0 < auVar38._0_8_);
                      auVar39._8_8_ = -(ulong)(0 < auVar38._8_8_);
                      auVar39 = auVar39 & auVar38;
                      *(undefined1 (*) [16])((long)*ptr + lVar22) = auVar39;
                      piVar4 = ((result->field_4).rowcols)->score_row;
                      *(int *)((long)piVar4 + uVar17) = auVar39._0_4_;
                      palVar23 = (__m128i *)((long)piVar4 + uVar17);
                      *(int *)((long)*palVar23 + lVar20) = auVar39._8_4_;
                      auVar30._0_8_ = -(ulong)(auVar42._0_8_ < auVar39._0_8_);
                      auVar30._8_8_ = -(ulong)(auVar42._8_8_ < auVar39._8_8_);
                      auVar42 = blendvpd(auVar42,auVar39,auVar30);
                      uStack_40 = (ulong)(uint)open;
                      auVar40._0_8_ = auVar39._0_8_ - (ulong)(uint)open;
                      auVar40._8_8_ = auVar39._8_8_ - uStack_40;
                      auVar41._0_8_ = auVar36._0_8_ - uVar28;
                      auVar41._8_8_ = auVar36._8_8_ - uStack_90;
                      auVar36._0_8_ = -(ulong)(auVar40._0_8_ < auVar41._0_8_);
                      auVar36._8_8_ = -(ulong)(auVar40._8_8_ < auVar41._8_8_);
                      auVar36 = blendvpd(auVar40,auVar41,auVar36);
                      *(undefined1 (*) [16])((long)*b + lVar22) = auVar36;
                      auVar44._0_8_ = auVar43._0_8_ - uVar28;
                      auVar44._8_8_ = auVar43._8_8_ - uStack_90;
                      auVar31._0_8_ = -(ulong)(auVar40._0_8_ < auVar44._0_8_);
                      auVar31._8_8_ = -(ulong)(auVar40._8_8_ < auVar44._8_8_);
                      auVar43 = blendvpd(auVar40,auVar44,auVar31);
                      plVar1 = (long *)((long)*palVar10 + lVar22);
                      lVar34 = *plVar1;
                      lVar37 = plVar1[1];
                      uVar17 = uVar17 + uVar27 * 4;
                    }
                    if (uVar21 == uVar13) {
                      palVar11 = local_130;
                    }
                    uVar15 = (ulong)uVar13;
                    for (iVar9 = 0; iVar9 != 2; iVar9 = iVar9 + 1) {
                      lStack_120 = auVar43._0_8_;
                      local_128 = 0;
                      uVar12 = uVar19;
                      uVar14 = 0;
                      while (uVar15 = uVar14 + 0x10, size * 0x10 + 0x10 != uVar15) {
                        auVar43 = *(undefined1 (*) [16])((long)*ptr + uVar14);
                        auVar8._8_8_ = lStack_120;
                        auVar8._0_8_ = local_128;
                        auVar32._0_8_ = -(ulong)(local_128 < auVar43._0_8_);
                        auVar32._8_8_ = -(ulong)(lStack_120 < auVar43._8_8_);
                        auVar43 = blendvpd(auVar8,auVar43,auVar32);
                        *(undefined1 (*) [16])((long)*ptr + uVar14) = auVar43;
                        piVar4 = ((result->field_4).rowcols)->score_row;
                        lVar34 = (long)piVar4 + uVar12;
                        *(int *)((long)piVar4 + uVar12) = auVar43._0_4_;
                        uVar5 = extractps(auVar43,2);
                        *(undefined8 *)(lVar20 + lVar34) = uVar5;
                        uVar12 = uVar12 + uVar27 * 4;
                        auVar33._0_8_ = -(ulong)(auVar42._0_8_ < auVar43._0_8_);
                        auVar33._8_8_ = -(ulong)(auVar42._8_8_ < auVar43._8_8_);
                        auVar42 = blendvpd(auVar42,auVar43,auVar33);
                        local_128 = local_128 - uVar28;
                        lStack_120 = lStack_120 - uStack_90;
                        b_00[1] = (longlong)piVar4;
                        b_00[0] = lVar34;
                        a[1] = lVar22;
                        a[0] = (longlong)palVar23;
                        _mm_cmpgt_epi64_rpl(a,b_00);
                        uVar6 = (ushort)(SUB161(extraout_XMM0 >> 7,0) & 1) |
                                (ushort)(SUB161(extraout_XMM0 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(extraout_XMM0 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(extraout_XMM0 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(extraout_XMM0 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(extraout_XMM0 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(extraout_XMM0 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(extraout_XMM0 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(extraout_XMM0 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(extraout_XMM0 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(extraout_XMM0 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(extraout_XMM0 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(extraout_XMM0 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(extraout_XMM0 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(extraout_XMM0 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(extraout_XMM0[0xf] >> 7) << 0xf;
                        uVar17 = (ulong)uVar6;
                        uVar14 = uVar15;
                        if (uVar6 == 0) goto LAB_00667a6c;
                      }
                      auVar43._8_8_ = lStack_120;
                      auVar43._0_8_ = local_128;
                      uVar15 = uVar14;
                    }
LAB_00667a6c:
                    b_01[1] = uVar15;
                    b_01[0] = uVar17;
                    a_00[1] = lVar22;
                    a_00[0] = (longlong)palVar23;
                    _mm_cmpgt_epi64_rpl(a_00,b_01);
                    local_130 = palVar10;
                    if ((((((((((((((((extraout_XMM0_00 >> 7 & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (extraout_XMM0_00 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (extraout_XMM0_00 >> 0x17 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                   (extraout_XMM0_00 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (extraout_XMM0_00 >> 0x27 & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                                 (extraout_XMM0_00 >> 0x2f & (undefined1  [16])0x1) !=
                                 (undefined1  [16])0x0) ||
                                (extraout_XMM0_00 >> 0x37 & (undefined1  [16])0x1) !=
                                (undefined1  [16])0x0) ||
                               (extraout_XMM0_00 >> 0x3f & (undefined1  [16])0x1) !=
                               (undefined1  [16])0x0) ||
                              (extraout_XMM0_00 >> 0x47 & (undefined1  [16])0x1) !=
                              (undefined1  [16])0x0) ||
                             (extraout_XMM0_00 >> 0x4f & (undefined1  [16])0x1) !=
                             (undefined1  [16])0x0) ||
                            (extraout_XMM0_00 >> 0x57 & (undefined1  [16])0x1) !=
                            (undefined1  [16])0x0) ||
                           (extraout_XMM0_00 >> 0x5f & (undefined1  [16])0x1) !=
                           (undefined1  [16])0x0) ||
                          (extraout_XMM0_00 >> 0x67 & (undefined1  [16])0x1) !=
                          (undefined1  [16])0x0) ||
                         (extraout_XMM0_00 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                         ) || (extraout_XMM0_00 >> 0x77 & (undefined1  [16])0x1) !=
                              (undefined1  [16])0x0) || extraout_XMM0_00[0xf] < '\0') {
                      local_d8 = auVar42._8_8_;
                      if (auVar42._8_8_ < auVar42._0_8_) {
                        local_d8 = auVar42._0_8_;
                      }
                      if ((long)len < local_d8) {
                        *(byte *)&result->flag = (byte)result->flag | 0x40;
                        s2Len = (int)uVar18;
                        goto LAB_00667b3b;
                      }
                      uVar26 = uVar18 & 0xffffffff;
                    }
                    uVar18 = uVar18 + 1;
                    uVar19 = uVar19 + 4;
                    palVar10 = ptr;
                  } while( true );
                }
              }
              return (parasail_result_t *)0x0;
            }
            __format = "%s: %s must be >= 0\n";
            pcVar16 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_table_striped_profile_sse41_128_64",pcVar16);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vNegInf;
    int64_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int64_t maxp = 0;
    /*int64_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_setzero_si128();
    vNegInf = _mm_set1_epi64x_rpl(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT64_MAX - (int64_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT64_MAX : (int64_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi64x_rpl(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            vH = _mm_max_epi64_rpl(vH, vZero);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 8);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi64_rpl(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi64_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi64x_rpl(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT64_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT64_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int64_t *t = (int64_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}